

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::
Table<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks>_>
::eraseImpl(Table<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks>_>
            *this,size_t pos)

{
  Entry *pEVar1;
  Entry *pEVar2;
  uint uVar3;
  undefined4 uVar4;
  RemoveConst<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> *pRVar5;
  size_t oldPos;
  
  Impl<0UL,_false>::erase(this,pos,(this->rows).builder.ptr + pos);
  pEVar1 = (this->rows).builder.ptr;
  pRVar5 = (this->rows).builder.pos;
  oldPos = ((long)pRVar5 - (long)pEVar1 >> 4) - 1;
  if (oldPos != pos) {
    Impl<0UL,_false>::move(this,oldPos,pos,pEVar1 + oldPos);
    pEVar2 = (this->rows).builder.ptr;
    pEVar1 = pEVar2 + oldPos;
    uVar3 = pEVar1->value;
    uVar4 = *(undefined4 *)&pEVar1->field_0xc;
    pEVar2 = pEVar2 + pos;
    pEVar2->key = pEVar1->key;
    pEVar2->value = uVar3;
    *(undefined4 *)&pEVar2->field_0xc = uVar4;
    pRVar5 = (this->rows).builder.pos;
  }
  (this->rows).builder.pos = pRVar5 + -1;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}